

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O3

void vkt::memory::anon_unknown_0::populateTestGroup(TestCaseGroup *group)

{
  char *__s;
  TestContext *testCtx;
  _Alloc_hider name;
  long *description;
  TestNode *pTVar1;
  TestNode *pTVar2;
  size_t sVar3;
  uint uVar4;
  uint *puVar5;
  char *__end;
  ulong uVar6;
  long lVar7;
  ostringstream caseName;
  undefined1 auStack_228 [11];
  undefined1 local_21d;
  uint local_21c;
  TestNode *local_218;
  string local_210;
  pointer local_1f0;
  TestNode *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  long local_1c0;
  ulong local_1b8;
  uint *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pTVar1 = (TestNode *)operator_new(0x70);
  local_1e8 = &group->super_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(group->super_TestNode).m_testCtx,"buffer","");
  lVar7 = 8;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,*(char **)((long)&DAT_00cf9e00 + lVar7),
               (allocator<char> *)local_1e0);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"","");
    pTVar2 = (TestNode *)
             createFunctionCase<unsigned_int>
                       (pTVar1->m_testCtx,NODETYPE_SELF_VALIDATE,local_1a8,&local_210,testBuffer,
                        *(uint *)(&UNK_00cf9df8 + lVar7));
    tcu::TestNode::addChild(pTVar1,pTVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    pTVar2 = local_1e8;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x58);
  tcu::TestNode::addChild(local_1e8,pTVar1);
  local_218 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_218,pTVar2->m_testCtx,"image","");
  lVar7 = 0;
  uVar6 = 0x100000002;
  local_1b8 = 0x100000002;
  do {
    puVar5 = &DAT_00cf9e50 + lVar7 * 4;
    pTVar1 = (TestNode *)CONCAT71((int7)((ulong)pTVar1 >> 8),1);
    local_1c0 = lVar7;
    local_1b0 = puVar5;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      local_21c = (uint)pTVar1;
      local_1f0 = (pointer)(ulong)*puVar5;
      local_21d = (undefined1)puVar5[1];
      __s = *(char **)(puVar5 + 2);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_228 +
                        (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x80);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
      }
      uVar4 = local_21c;
      if ((local_21c & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"_tiling_optimal",0xf);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"_tiling_linear",0xe);
        local_1f0 = (pointer)((ulong)local_1f0 | 0x100000000);
      }
      if (((ulong)local_1f0 & 0x100000002) != uVar6) {
        std::__cxx11::stringbuf::str();
        local_1e0[0] = local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
        description = local_1e0[0];
        name._M_p = local_210._M_dataplus._M_p;
        testCtx = local_218->m_testCtx;
        pTVar1 = (TestNode *)operator_new(0x90);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar1,testCtx,NODETYPE_SELF_VALIDATE,name._M_p,(char *)description);
        pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf9ec0;
        pTVar1[1].m_testCtx = (TestContext *)testImage;
        pTVar1[1].m_name._M_dataplus._M_p = local_1f0;
        *(undefined1 *)&pTVar1[1].m_name._M_string_length = local_21d;
        tcu::TestNode::addChild(local_218,pTVar1);
        puVar5 = local_1b0;
        uVar4 = local_21c;
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
        uVar6 = local_1b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar1 = (TestNode *)0x0;
    } while ((uVar4 & 1) != 0);
    lVar7 = local_1c0 + 1;
  } while (lVar7 != 6);
  tcu::TestNode::addChild(local_1e8,local_218);
  return;
}

Assistant:

void populateTestGroup (tcu::TestCaseGroup* group)
{
	// Buffers
	{
		const struct
		{
			VkBufferCreateFlags		flags;
			const char* const		name;
		} bufferCases[] =
		{
			{ (VkBufferCreateFlags)0,																								"regular"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT,																					"sparse"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,											"sparse_residency"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT											| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_aliased"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> bufferGroup(new tcu::TestCaseGroup(group->getTestContext(), "buffer", ""));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bufferCases); ++ndx)
			addFunctionCase(bufferGroup.get(), bufferCases[ndx].name, "", testBuffer, bufferCases[ndx].flags);

		group->addChild(bufferGroup.release());
	}

	// Images
	{
		const struct
		{
			VkImageCreateFlags		flags;
			bool					transient;
			const char* const		name;
		} imageFlagsCases[] =
		{
			{ (VkImageCreateFlags)0,																								false,	"regular"					},
			{ (VkImageCreateFlags)0,																								true,	"transient"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT,																					false,	"sparse"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT,											false,	"sparse_residency"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT											| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_aliased"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT		| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(group->getTestContext(), "image", ""));

		for (int flagsNdx = 0; flagsNdx < DE_LENGTH_OF_ARRAY(imageFlagsCases); ++flagsNdx)
		for (int tilingNdx = 0; tilingNdx <= 1; ++tilingNdx)
		{
			ImageParams			params;
			std::ostringstream	caseName;

			params.flags		=  imageFlagsCases[flagsNdx].flags;
			params.transient	=  imageFlagsCases[flagsNdx].transient;
			caseName			<< imageFlagsCases[flagsNdx].name;

			if (tilingNdx != 0)
			{
				params.tiling =  VK_IMAGE_TILING_OPTIMAL;
				caseName      << "_tiling_optimal";
			}
			else
			{
				params.tiling =  VK_IMAGE_TILING_LINEAR;
				caseName      << "_tiling_linear";
			}

			if ((params.flags & VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT) && (params.tiling == VK_IMAGE_TILING_LINEAR))
				continue;

			addFunctionCase(imageGroup.get(), caseName.str(), "", testImage, params);
		}

		group->addChild(imageGroup.release());
	}
}